

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcPrsOpUnary::parse(CTcPrsOpUnary *this)

{
  uint uVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var;
  
  tVar2 = (G_tok->curtok_).typ_;
  uVar1 = tVar2 - TOKT_AND;
  if (uVar1 < 0x40) {
    if ((0x8000000000600300U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001ff229;
    if ((ulong)uVar1 == 0) {
      CTcTokenizer::next(G_tok);
      pCVar4 = parse_addr(this);
      return pCVar4;
    }
  }
  if (1 < tVar2 - TOKT_PLUS) {
    pCVar4 = parse_postfix(1,1);
    return pCVar4;
  }
LAB_001ff229:
  CTcTokenizer::next(G_tok);
  iVar3 = (**(this->super_CTcPrsOp)._vptr_CTcPrsOp)(this);
  pCVar4 = (CTcPrsNode *)CONCAT44(extraout_var,iVar3);
  if (pCVar4 != (CTcPrsNode *)0x0) {
    if ((int)tVar2 < 0x34) {
      if (tVar2 == TOKT_PLUS) {
        pCVar4 = parse_pos(pCVar4);
        return pCVar4;
      }
      if (tVar2 == TOKT_MINUS) {
        pCVar4 = parse_neg(pCVar4);
        return pCVar4;
      }
      if (tVar2 == TOKT_INC) {
        pCVar4 = parse_inc(1,pCVar4);
        return pCVar4;
      }
    }
    else if ((int)tVar2 < 0x41) {
      if (tVar2 == TOKT_DEC) {
        pCVar4 = parse_dec(1,pCVar4);
        return pCVar4;
      }
      if (tVar2 == TOKT_NOT) {
        pCVar4 = parse_not(pCVar4);
        return pCVar4;
      }
    }
    else {
      if (tVar2 == TOKT_BNOT) {
        pCVar4 = parse_bnot(pCVar4);
        return pCVar4;
      }
      if (tVar2 == TOKT_DELETE) {
        pCVar4 = parse_delete(pCVar4);
        return pCVar4;
      }
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse() const
{
    /* get the current token, which may be a prefix operator */
    tc_toktyp_t op = G_tok->cur();

    /* check for prefix operators */
    switch(op)
    {
    case TOKT_AND:
        /* skip the '&' */
        G_tok->next();
        
        /* parse the address expression */
        return parse_addr();

    case TOKT_NOT:
    case TOKT_BNOT:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_INC:
    case TOKT_DEC:
    case TOKT_DELETE:
        {
            /* skip the operator */
            G_tok->next();
            
            /* 
             *   recursively parse the unary expression to which to apply the
             *   operator 
             */
            CTcPrsNode *sub = parse();
            if (sub == 0)
                return 0;
            
            /* apply the operator */
            switch(op)
            {
            case TOKT_NOT:
                /* apply the NOT operator */
                return parse_not(sub);
                
            case TOKT_BNOT:
                /* apply the bitwise NOT operator */
                return parse_bnot(sub);
                
            case TOKT_PLUS:
                /* apply the unary positive operator */
                return parse_pos(sub);
                
            case TOKT_MINUS:
                /* apply the unary negation operator */
                return parse_neg(sub);
                
            case TOKT_INC:
                /* apply the pre-increment operator */
                return parse_inc(TRUE, sub);
                
            case TOKT_DEC:
                /* apply the pre-decrement operator */
                return parse_dec(TRUE, sub);
                
            case TOKT_DELETE:
                /* apply the deletion operator */
                return parse_delete(sub);
                
            default:
                /* 
                 *   we shouldn't ever get here, since this switch should
                 *   contain every case that brought us into it in the first
                 *   place
                 */
                return 0;
            }
        }

    default:
        /* it's not a unary prefix operator - parse a postfix expression */
        return parse_postfix(TRUE, TRUE);
    }
}